

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

wchar_t square_trap_timeout(chunk *c,loc grid,wchar_t t_idx)

{
  uint8_t *puVar1;
  trap *ptVar2;
  square *psVar3;
  trap *ptVar4;
  
  psVar3 = square((chunk_conflict *)c,grid);
  ptVar4 = psVar3->trap;
  do {
    while( true ) {
      if (ptVar4 == (trap *)0x0) {
        return L'\0';
      }
      ptVar2 = ptVar4->next;
      if ((t_idx < L'\0') || ((uint)ptVar4->t_idx == t_idx)) break;
      ptVar4 = ptVar2;
      if (ptVar2 == (trap *)0x0) {
        return L'\0';
      }
    }
    puVar1 = &ptVar4->timeout;
    ptVar4 = ptVar2;
  } while (*puVar1 == 0);
  return (uint)*puVar1;
}

Assistant:

int square_trap_timeout(struct chunk *c, struct loc grid, int t_idx)
{
	struct trap *current_trap = square(c, grid)->trap;
	while (current_trap) {
		/* Get the next trap (may be NULL) */
		struct trap *next_trap = current_trap->next;

		/* If called with a specific index, skip others */
		if ((t_idx >= 0) && (t_idx != current_trap->t_idx)) {
			if (!next_trap) break;
			current_trap = next_trap;
			continue;
		}

		/* If the timer is set, return the value */
		if (current_trap->timeout)
			return current_trap->timeout;

		/* Replace with the next trap */
		current_trap = next_trap;
    }

	return 0;
}